

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O0

ssize_t __thiscall
capnp::Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
          (Request<capnp::DynamicStruct,_capnp::DynamicStruct> *this,int __fd,void *__buf,size_t __n
          ,int __flags)

{
  StructSchema schema;
  RequestHook *pRVar1;
  Type *func;
  Pipeline *pPVar2;
  Promise<capnp::Response<capnp::DynamicStruct>_> *promise;
  Pipeline *pipeline;
  undefined4 in_register_00000034;
  ArrayDisposer *pAVar3;
  undefined1 local_a0 [8];
  Pipeline typedPipeline;
  Promise<capnp::Response<capnp::DynamicStruct>_> local_68;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_dynamic_capability_c__:90:13),_capnp::Response<capnp::AnyPointer>_>
  typedPromise;
  StructSchema resultSchemaCopy;
  undefined1 local_48 [8];
  RemotePromise<capnp::AnyPointer> typelessPromise;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> *this_local;
  
  pAVar3 = (ArrayDisposer *)CONCAT44(in_register_00000034,__fd);
  typelessPromise.super_Pipeline.ops.disposer = pAVar3;
  pRVar1 = kj::Own<capnp::RequestHook,_std::nullptr_t>::operator->
                     ((Own<capnp::RequestHook,_std::nullptr_t> *)(pAVar3 + 6));
  (**pRVar1->_vptr_RequestHook)(local_48);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::operator=
            ((Own<capnp::RequestHook,_std::nullptr_t> *)(pAVar3 + 6),(void *)0x0);
  typedPromise.super_PromiseBase.node.ptr = (PromiseBase)pAVar3[8]._vptr_ArrayDisposer;
  func = (Type *)kj::
                 implicitCast<kj::Promise<capnp::Response<capnp::AnyPointer>>&,capnp::RemotePromise<capnp::AnyPointer>&>
                           ((RemotePromise<capnp::AnyPointer> *)local_48);
  typedPipeline.typeless.ops.disposer = (ArrayDisposer *)typedPromise.super_PromiseBase.node.ptr;
  kj::Promise<capnp::Response<capnp::AnyPointer>>::
  then<capnp::Request<capnp::DynamicStruct,capnp::DynamicStruct>::send()::__0>
            ((Promise<capnp::Response<capnp::AnyPointer>> *)&local_68,func);
  schema.super_Schema.raw = (Schema)pAVar3[8]._vptr_ArrayDisposer;
  pPVar2 = kj::implicitCast<capnp::AnyPointer::Pipeline&,capnp::RemotePromise<capnp::AnyPointer>&>
                     ((RemotePromise<capnp::AnyPointer> *)local_48);
  pPVar2 = kj::mv<capnp::AnyPointer::Pipeline>(pPVar2);
  DynamicStruct::Pipeline::Pipeline((Pipeline *)local_a0,schema,pPVar2);
  promise = kj::mv<kj::Promise<capnp::Response<capnp::DynamicStruct>>>(&local_68);
  pipeline = kj::mv<capnp::DynamicStruct::Pipeline>((Pipeline *)local_a0);
  RemotePromise<capnp::DynamicStruct>::RemotePromise
            ((RemotePromise<capnp::DynamicStruct> *)this,promise,pipeline);
  DynamicStruct::Pipeline::~Pipeline((Pipeline *)local_a0);
  kj::Promise<capnp::Response<capnp::DynamicStruct>_>::~Promise(&local_68);
  RemotePromise<capnp::AnyPointer>::~RemotePromise((RemotePromise<capnp::AnyPointer> *)local_48);
  return (ssize_t)this;
}

Assistant:

RemotePromise<DynamicStruct> Request<DynamicStruct, DynamicStruct>::send() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse
  auto resultSchemaCopy = resultSchema;

  // Convert the Promise to return the correct response type.
  // Explicitly upcast to kj::Promise to make clear that calling .then() doesn't invalidate the
  // Pipeline part of the RemotePromise.
  auto typedPromise = kj::implicitCast<kj::Promise<Response<AnyPointer>>&>(typelessPromise)
      .then([=](Response<AnyPointer>&& response) -> Response<DynamicStruct> {
        return Response<DynamicStruct>(response.getAs<DynamicStruct>(resultSchemaCopy),
                                       kj::mv(response.hook));
      });

  // Wrap the typeless pipeline in a typed wrapper.
  DynamicStruct::Pipeline typedPipeline(resultSchema,
      kj::mv(kj::implicitCast<AnyPointer::Pipeline&>(typelessPromise)));

  return RemotePromise<DynamicStruct>(kj::mv(typedPromise), kj::mv(typedPipeline));
}